

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result wabt::anon_unknown_1::CheckTypes
                 (Location *loc,TypeVector *actual,TypeVector *expected,char *desc,char *index_kind,
                 Errors *errors)

{
  Enum EVar1;
  Enum EVar2;
  Enum EVar3;
  char *pcVar4;
  char *pcVar5;
  pointer pTVar6;
  ulong uVar7;
  pointer pTVar8;
  byte bVar9;
  Type local_84;
  ErrorLevel local_80;
  Type local_7c;
  TypeVector *local_78;
  char *local_70;
  Location *local_68;
  vector<wabt::Error,std::allocator<wabt::Error>> *local_60;
  TypeVector *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar6 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar8 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_58 = actual;
  if ((long)pTVar8 - (long)pTVar6 >> 2 ==
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2) {
    if (pTVar8 == pTVar6) {
      EVar3 = Ok;
    }
    else {
      bVar9 = 0;
      uVar7 = 0;
      local_78 = expected;
      local_70 = desc;
      local_68 = loc;
      local_60 = (vector<wabt::Error,std::allocator<wabt::Error>> *)index_kind;
      do {
        EVar1 = pTVar6[uVar7].enum_;
        EVar2 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar7].enum_;
        if (EVar1 != EVar2) {
          local_80 = Error;
          local_84.enum_ = EVar1;
          local_7c.enum_ = EVar2;
          pcVar4 = Type::GetName(&local_84);
          pcVar5 = Type::GetName(&local_7c);
          StringPrintf_abi_cxx11_
                    (&local_50,"type mismatch for %s %u of %s. got %s, expected %s",local_70,
                     uVar7 & 0xffffffff,"function",pcVar4,pcVar5);
          std::vector<wabt::Error,std::allocator<wabt::Error>>::
          emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
                    (local_60,&local_80,local_68,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          pTVar6 = (local_58->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pTVar8 = (local_58->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          expected = local_78;
        }
        bVar9 = bVar9 | EVar1 != EVar2;
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)((long)pTVar8 - (long)pTVar6 >> 2));
      EVar3 = (Enum)bVar9;
    }
  }
  else {
    local_84.enum_ = ~I64;
    StringPrintf_abi_cxx11_(&local_50,"expected %zd %ss, got %zd");
    std::vector<wabt::Error,std::allocator<wabt::Error>>::
    emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
              ((vector<wabt::Error,std::allocator<wabt::Error>> *)index_kind,(ErrorLevel *)&local_84
               ,loc,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    EVar3 = Error;
  }
  return (Result)EVar3;
}

Assistant:

Result CheckTypes(const Location& loc,
                  const TypeVector& actual,
                  const TypeVector& expected,
                  const char* desc,
                  const char* index_kind,
                  Errors* errors) {
  Result result = Result::Ok;
  if (actual.size() == expected.size()) {
    for (size_t i = 0; i < actual.size(); ++i) {
      result |= CheckTypeIndex(loc, actual[i], expected[i], desc, i, index_kind,
                               errors);
    }
  } else {
    errors->emplace_back(
        ErrorLevel::Error, loc,
        StringPrintf("expected %" PRIzd " %ss, got %" PRIzd, expected.size(),
                     index_kind, actual.size()));
    result = Result::Error;
  }
  return result;
}